

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O3

int lws_add_http_header_by_name(lws *wsi,uchar *name,uchar *value,int length,uchar **p,uchar *end)

{
  uchar uVar1;
  uchar *puVar2;
  int iVar3;
  size_t __n;
  bool bVar4;
  
  if ((wsi->role_ops == &role_ops_h2) || ((wsi->wsistate & 0xf000000) == 0x1000000)) {
    iVar3 = lws_add_http2_header_by_name(wsi,name,value,length,p,end);
    return iVar3;
  }
  if (name != (uchar *)0x0) {
    for (; (puVar2 = *p, puVar2 < end && (uVar1 = *name, uVar1 != '\0')); name = name + 1) {
      *p = puVar2 + 1;
      *puVar2 = uVar1;
    }
    if (puVar2 == end) {
      return 1;
    }
    *p = puVar2 + 1;
    *puVar2 = ' ';
  }
  __n = (size_t)length;
  bVar4 = *p + __n + 3 < end;
  if (bVar4) {
    memcpy(*p,value,__n);
    puVar2 = *p;
    *p = puVar2 + __n + 1;
    puVar2[__n] = '\r';
    puVar2 = *p;
    *p = puVar2 + 1;
    *puVar2 = '\n';
  }
  return (uint)!bVar4;
}

Assistant:

int
lws_add_http_header_by_name(struct lws *wsi, const unsigned char *name,
			    const unsigned char *value, int length,
			    unsigned char **p, unsigned char *end)
{
#ifdef LWS_WITH_HTTP2
	if (lwsi_role_h2(wsi) || lwsi_role_h2_ENCAPSULATION(wsi))
		return lws_add_http2_header_by_name(wsi, name,
						    value, length, p, end);
#else
	(void)wsi;
#endif
	if (name) {
		while (*p < end && *name)
			*((*p)++) = *name++;
		if (*p == end)
			return 1;
		*((*p)++) = ' ';
	}
	if (*p + length + 3 >= end)
		return 1;

	memcpy(*p, value, length);
	*p += length;
	*((*p)++) = '\x0d';
	*((*p)++) = '\x0a';

	return 0;
}